

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O1

void __thiscall
phyr::Film::mergeFilmTile
          (Film *this,unique_ptr<phyr::FilmTile,_std::default_delete<phyr::FilmTile>_> *tile)

{
  FilmTile *pFVar1;
  ulong uVar2;
  Point2<int> PVar3;
  long lVar4;
  Pixel *pPVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  double xyz [3];
  double local_48;
  double local_40;
  double local_38;
  
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  pFVar1 = (tile->_M_t).super___uniq_ptr_impl<phyr::FilmTile,_std::default_delete<phyr::FilmTile>_>.
           _M_t.super__Tuple_impl<0UL,_phyr::FilmTile_*,_std::default_delete<phyr::FilmTile>_>.
           super__Head_base<0UL,_phyr::FilmTile_*,_false>._M_head_impl;
  uVar2 = *(ulong *)&(pFVar1->pixelBounds).pMin;
  PVar3 = (pFVar1->pixelBounds).pMax;
  iVar6 = PVar3.y;
  uVar7 = uVar2 >> 0x20;
  iVar9 = (int)(uVar2 >> 0x20);
  if (iVar6 <= iVar9) {
    iVar6 = iVar9;
  }
  uVar8 = PVar3.x;
  if ((int)uVar8 <= (int)uVar2) {
    iVar6 = iVar9;
  }
  if (iVar6 != iVar9) {
    uVar12 = uVar2 & 0xffffffff;
    uVar13 = uVar2;
    do {
      pFVar1 = (tile->_M_t).
               super___uniq_ptr_impl<phyr::FilmTile,_std::default_delete<phyr::FilmTile>_>._M_t.
               super__Tuple_impl<0UL,_phyr::FilmTile_*,_std::default_delete<phyr::FilmTile>_>.
               super__Head_base<0UL,_phyr::FilmTile_*,_false>._M_head_impl;
      iVar9 = (pFVar1->pixelBounds).pMin.x;
      iVar11 = (int)uVar12;
      lVar4 = *(long *)&(pFVar1->pixels).
                        super__Vector_base<phyr::FilmTilePixel,_std::allocator<phyr::FilmTilePixel>_>
                        ._M_impl;
      lVar10 = (long)((iVar11 - iVar9) +
                     ((pFVar1->pixelBounds).pMax.x - iVar9) *
                     ((int)uVar7 - *(int *)((long)&(pFVar1->pixelBounds).pMin + 4))) * 0x1e8;
      iVar9 = (this->croppedImageBounds).pMin.x;
      iVar9 = (iVar11 - iVar9) +
              ((int)uVar7 - (this->croppedImageBounds).pMin.y) *
              ((this->croppedImageBounds).pMax.x - iVar9);
      pPVar5 = (this->pixels)._M_t.
               super___uniq_ptr_impl<phyr::Film::Pixel,_std::default_delete<phyr::Film::Pixel[]>_>.
               _M_t.
               super__Tuple_impl<0UL,_phyr::Film::Pixel_*,_std::default_delete<phyr::Film::Pixel[]>_>
               .super__Head_base<0UL,_phyr::Film::Pixel_*,_false>._M_head_impl;
      SampledSpectrum::toXYZConstants((SampledSpectrum *)(lVar10 + lVar4),&local_48);
      pPVar5[iVar9].xyz[0] = local_48 + pPVar5[iVar9].xyz[0];
      pPVar5[iVar9].xyz[1] = local_40 + pPVar5[iVar9].xyz[1];
      pPVar5[iVar9].xyz[2] = local_38 + pPVar5[iVar9].xyz[2];
      uVar12 = (uVar13 & 0xffffffff00000000) + (uVar2 & 0xffffffff) + 0x100000000;
      if (iVar11 + 1U != uVar8) {
        uVar12 = (ulong)(iVar11 + 1U) | uVar13 & 0xffffffff00000000;
      }
      pPVar5[iVar9].filterWeightSum =
           *(double *)(lVar4 + 0x1e0 + lVar10) + pPVar5[iVar9].filterWeightSum;
      uVar7 = uVar12 >> 0x20;
      uVar13 = uVar12;
    } while (((int)uVar2 != (int)uVar12) || (iVar6 != (int)(uVar12 >> 0x20)));
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return;
}

Assistant:

void Film::mergeFilmTile(std::unique_ptr<FilmTile> tile) {
    // Acquire lock
    std::lock_guard<std::mutex> lock(mutex);

    // Iterate through all pixels within pixel bounds
    for (Point2i pixel : tile->getPixelBounds()) {
        // Merge pixel into {Film::pixels}
        FilmTilePixel& tilePixel = tile->getPixel(pixel);
        Pixel& filmPixel = getPixel(pixel);

        // Get xyz spectrum data
        Real xyz[3];
        tilePixel.contributionSum.toXYZConstants(xyz);
        // Add spectrum data to {filmPixel}
        filmPixel.xyz[0] += xyz[0]; filmPixel.xyz[1] += xyz[1];
        filmPixel.xyz[2] += xyz[2];
        filmPixel.filterWeightSum += tilePixel.filterWeightSum;
    }
}